

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

ssize_t __thiscall Image::write(Image *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  long *plVar3;
  ssize_t sVar4;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  uint uVar5;
  Size *pSVar6;
  long *plVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  uint __len;
  string __str;
  string path;
  long *local_98;
  undefined8 uStack_90;
  long local_88 [2];
  _InputArray local_78;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  void *local_38;
  
  uVar1 = *__buf;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0010477d;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0010477d;
      }
      if (uVar5 < 10000) goto LAB_0010477d;
      uVar8 = uVar8 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0010477d:
  local_98 = local_88;
  local_38 = (void *)__n;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_98 + (ulong)(uVar1 >> 0x1f)),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1060f4);
  pSVar6 = (Size *)(plVar3 + 2);
  if ((Size *)*plVar3 == pSVar6) {
    local_78.sz = *pSVar6;
    lStack_60 = plVar3[3];
    local_78._0_8_ = &local_78.sz;
  }
  else {
    local_78.sz = *pSVar6;
    local_78._0_8_ = (Size *)*plVar3;
  }
  local_78.obj = (void *)plVar3[1];
  *plVar3 = (long)pSVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_78,*(ulong *)CONCAT44(in_register_00000034,__fd));
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_48 = *plVar7;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar7;
    local_58 = (long *)*plVar3;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((Size *)local_78._0_8_ != &local_78.sz) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)local_78.sz + 1));
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  local_78.sz.width = 0;
  local_78.sz.height = 0;
  local_78.flags = 0x1010000;
  local_78.obj = local_38;
  local_88[0] = 0;
  local_98 = (long *)0x0;
  uStack_90 = 0;
  sVar4 = cv::imwrite((string *)&local_58,&local_78,(vector *)&local_98);
  if (local_98 != (long *)0x0) {
    operator_delete(local_98,local_88[0] - (long)local_98);
    sVar4 = extraout_RAX;
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
    sVar4 = extraout_RAX_00;
  }
  return sVar4;
}

Assistant:

void Image::write(std::string filename,  const int &iteration, const cv::Mat& image) {
    std::string path = "../results/"+ std::to_string(iteration)  + filename;
    cv::imwrite(path, image);
}